

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void vmread_(PDISASM pMyDisasm)

{
  _Bool _Var1;
  Int32 IVar2;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      if ((pMyDisasm->Reserved_).EVEX.W == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
        strcpy((pMyDisasm->Instruction).Mnemonic,"vcvttpd2uqq");
        vex_GxEx(pMyDisasm);
      }
      else {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x02';
        strcpy((pMyDisasm->Instruction).Mnemonic,"vcvttps2uqq");
        vex_GEx(pMyDisasm,0x68,0x6d,0x6e);
      }
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\x02') {
      (pMyDisasm->Instruction).Category = 0x140000;
      (pMyDisasm->Reserved_).EVEX.tupletype = '\a';
      strcpy((pMyDisasm->Instruction).Mnemonic,"vcvttss2usi");
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
      IVar2 = 0x20;
      if ((pMyDisasm->Reserved_).EVEX.W == '\x01') {
        IVar2 = 0x40;
      }
      (pMyDisasm->Reserved_).OperandSize = IVar2;
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).Register_ = 4;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\x03') {
      (pMyDisasm->Instruction).Category = 0x140000;
      (pMyDisasm->Reserved_).EVEX.tupletype = '\b';
      strcpy((pMyDisasm->Instruction).Mnemonic,"vcvttsd2usi");
      IVar2 = 0x67;
      if ((pMyDisasm->Reserved_).EVEX.W == '\x01') {
        IVar2 = 0x68;
      }
      (pMyDisasm->Reserved_).MemDecoration = IVar2;
      IVar2 = 0x20;
      if ((pMyDisasm->Reserved_).EVEX.W == '\x01') {
        IVar2 = 0x40;
      }
      (pMyDisasm->Reserved_).OperandSize = IVar2;
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).Register_ = 4;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
    }
    else if ((pMyDisasm->Reserved_).EVEX.W == '\x01') {
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
      strcpy((pMyDisasm->Instruction).Mnemonic,"vcvttpd2udq");
      vex_GxEx(pMyDisasm);
    }
    else {
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
      strcpy((pMyDisasm->Instruction).Mnemonic,"vcvttps2udq");
      vex_GxEx(pMyDisasm);
    }
  }
  else if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    failDecode(pMyDisasm);
  }
  else {
    _Var1 = prefixes_present(pMyDisasm);
    if (_Var1) {
      failDecode(pMyDisasm);
    }
    else {
      (pMyDisasm->Instruction).Category = 0xb0000;
      strcpy((pMyDisasm->Instruction).Mnemonic,"vmread");
      if ((pMyDisasm->Reserved_).Architecture == 0x40) {
        (pMyDisasm->Reserved_).OperandSize = 0x40;
      }
      EvGv(pMyDisasm);
      if ((pMyDisasm->Reserved_).Architecture == 0x40) {
        (pMyDisasm->Reserved_).OperandSize = 0x20;
      }
    }
  }
  return;
}

Assistant:

void __bea_callspec__ vmread_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 1) {
        GV.EVEX.tupletype = FULL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvttpd2uqq");
        #endif
        vex_GxEx(pMyDisasm);
      }
      else {
        GV.EVEX.tupletype = HALF;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvttps2uqq");
        #endif
        vex_GEx(pMyDisasm, Arg2qword, Arg2_m128_xmm, Arg2_m256_ymm);
      }
    }
    else if (GV.VEX.pp == 2) {
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      GV.EVEX.tupletype = TUPLE1_FIXED__32;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvttss2usi");
      #endif
      GV.MemDecoration = Arg2dword;
      GV.OperandSize = (GV.EVEX.W == 1) ? 64 : 32;
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    else if (GV.VEX.pp == 3) {
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      GV.EVEX.tupletype = TUPLE1_FIXED__64;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvttsd2usi");
      #endif
      GV.MemDecoration = (GV.EVEX.W == 1) ? Arg2qword : Arg2dword;
      GV.OperandSize = (GV.EVEX.W == 1) ? 64 : 32;
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    else {
      if (GV.EVEX.W == 1) {
        GV.EVEX.tupletype = FULL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvttpd2udq");
        #endif
        vex_GxEx(pMyDisasm);
      }
      else {
        GV.EVEX.tupletype = FULL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvttps2udq");
        #endif
        vex_GxEx(pMyDisasm);
      }
    }
  }
  else if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  }
  else {
    if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
    pMyDisasm->Instruction.Category = VM_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmread");
    #endif
    if (GV.Architecture == 64) GV.OperandSize = 64;
    EvGv(pMyDisasm);
    if (GV.Architecture == 64) GV.OperandSize = 32;
  }
}